

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
Assimp::FBX::FBXConverter::ConvertMeshMultiMaterial
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          FBXConverter *this,MeshGeometry *mesh,Model *model,aiMatrix4x4 *node_global_transform,
          aiNode *nd)

{
  _Rb_tree_color _Var1;
  int *piVar2;
  _Base_ptr p_Var3;
  MatIndexArray *pMVar4;
  _Base_ptr p_Var5;
  const_iterator __begin2;
  int *piVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  const_iterator __end2;
  value_type_conflict4 index;
  set<int,_std::less<int>,_std::allocator<int>_> had;
  uint local_78;
  int local_74;
  aiMatrix4x4 *local_70;
  aiNode *local_68;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  local_70 = node_global_transform;
  local_68 = nd;
  pMVar4 = MeshGeometry::GetMaterialIndices(mesh);
  piVar6 = (pMVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar2 = (pMVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar2 == piVar6) {
    __assert_fail("mindices.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXConverter.cpp"
                  ,0x4c0,
                  "std::vector<unsigned int> Assimp::FBX::FBXConverter::ConvertMeshMultiMaterial(const MeshGeometry &, const Model &, const aiMatrix4x4 &, aiNode &)"
                 );
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    local_74 = *piVar6;
    if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_005b1f4e:
      local_78 = ConvertMeshMultiMaterial(this,mesh,model,local_74,local_70,local_68);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (__return_storage_ptr__,&local_78);
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_60,&local_74);
    }
    else {
      p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var8 = &local_60._M_impl.super__Rb_tree_header._M_header;
      do {
        p_Var7 = p_Var8;
        p_Var5 = p_Var3;
        _Var1 = p_Var5[1]._M_color;
        p_Var8 = p_Var5;
        if ((int)_Var1 < local_74) {
          p_Var8 = p_Var7;
        }
        p_Var3 = (&p_Var5->_M_left)[(int)_Var1 < local_74];
      } while ((&p_Var5->_M_left)[(int)_Var1 < local_74] != (_Base_ptr)0x0);
      if ((_Rb_tree_header *)p_Var8 == &local_60._M_impl.super__Rb_tree_header) goto LAB_005b1f4e;
      if ((int)_Var1 < local_74) {
        p_Var5 = p_Var7;
      }
      if (local_74 < (int)p_Var5[1]._M_color) goto LAB_005b1f4e;
    }
    piVar6 = piVar6 + 1;
    if (piVar6 == piVar2) {
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_60);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::vector<unsigned int> FBXConverter::ConvertMeshMultiMaterial(const MeshGeometry& mesh, const Model& model,
            const aiMatrix4x4& node_global_transform, aiNode& nd)
        {
            const MatIndexArray& mindices = mesh.GetMaterialIndices();
            ai_assert(mindices.size());

            std::set<MatIndexArray::value_type> had;
            std::vector<unsigned int> indices;

            for (MatIndexArray::value_type index : mindices) {
                if (had.find(index) == had.end()) {

                    indices.push_back(ConvertMeshMultiMaterial(mesh, model, index, node_global_transform, nd));
                    had.insert(index);
                }
            }

            return indices;
        }